

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Tokenizer::ConsumeLineComment(Tokenizer *this,string *content)

{
  string *in_RSI;
  Tokenizer *in_RDI;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  if (in_RSI != (string *)0x0) {
    RecordTo(in_RDI,in_RSI);
  }
  while( true ) {
    uVar1 = false;
    if (in_RDI->current_char_ != '\0') {
      uVar1 = in_RDI->current_char_ != '\n';
    }
    if ((bool)uVar1 == false) break;
    NextChar((Tokenizer *)CONCAT17(uVar1,in_stack_ffffffffffffffe0));
  }
  TryConsume(in_RDI,'\0');
  if (in_RSI != (string *)0x0) {
    StopRecording((Tokenizer *)CONCAT17(uVar1,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

void Tokenizer::ConsumeLineComment(std::string* content) {
  if (content != NULL) RecordTo(content);

  while (current_char_ != '\0' && current_char_ != '\n') {
    NextChar();
  }
  TryConsume('\n');

  if (content != NULL) StopRecording();
}